

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_erasure.cpp
# Opt level: O1

int main(void)

{
  function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&)> *pfVar1;
  int iVar2;
  App example;
  stringstream str;
  long *local_1e0 [2];
  long local_1d0 [2];
  App local_1c0;
  stringstream local_190 [16];
  basic_ostream<char,_std::char_traits<char>_> local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<App,_0>(&local_1c0,
                   (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                    *)local_1e0);
  if (local_1c0.drawable.draw.super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    pfVar1 = &local_1c0.drawable.draw;
    (*local_1c0.drawable.draw._M_invoker)((_Any_data *)pfVar1,local_180);
    std::__cxx11::stringbuf::str();
    iVar2 = std::__cxx11::string::compare((char *)local_1e0);
    if (iVar2 == 0) {
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
      if (local_1c0.drawable.draw.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_1c0.drawable.draw.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
      if (local_1c0.drawable.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1c0.drawable.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__cxx11::stringstream::~stringstream(local_190);
      std::ios_base::~ios_base(local_110);
      return 0;
    }
  }
  __assert_fail("\"Square\" == str.str()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/type_erasure.cpp"
                ,0x2f,"int main()");
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}